

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O3

uint8 * google::protobuf::internal::WireFormatLite::WriteGroupToArray
                  (int field_number,MessageLite *value,uint8 *target)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  byte *pbVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar2 = field_number * 8 + 3;
  uVar7 = field_number << 3;
  if (uVar7 < 0x80) {
    uVar5 = (ulong)uVar2;
  }
  else {
    uVar5 = (ulong)uVar2;
    do {
      *target = (byte)uVar2 | 0x80;
      uVar5 = uVar5 >> 7;
      target = target + 1;
      bVar1 = 0x3fff < uVar2;
      uVar2 = (uint)uVar5;
    } while (bVar1);
  }
  *target = (byte)uVar5;
  iVar3 = (*value->_vptr_MessageLite[0x10])(value,0,target + 1);
  pbVar4 = (byte *)CONCAT44(extraout_var,iVar3);
  uVar2 = uVar7 | 4;
  uVar6 = uVar2;
  if (0x7f < uVar7) {
    do {
      *pbVar4 = (byte)uVar2 | 0x80;
      uVar6 = uVar2 >> 7;
      pbVar4 = pbVar4 + 1;
      bVar1 = 0x3fff < uVar2;
      uVar2 = uVar6;
    } while (bVar1);
  }
  *pbVar4 = (byte)uVar6;
  return pbVar4 + 1;
}

Assistant:

INL static uint8* WriteGroupToArray(int field_number,
                                      const MessageLite& value, uint8* target) {
    return InternalWriteGroupToArray(field_number, value, false, target);
  }